

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Federate.cpp
# Opt level: O1

void __thiscall helics::Federate::requestTimeAsync(Federate *this,Time nextInternalTimeStep)

{
  element_type *peVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  _Result<TimeRepresentation<count_time<9,_long>_>_> *p_Var4;
  InvalidFunctionCall *this_00;
  char *pcVar5;
  size_t sVar6;
  _State_baseV2 *__tmp;
  bool bVar7;
  string_view message;
  shared_ptr<std::__future_base::_State_baseV2> __state;
  handle asyncInfo;
  __state_type local_88;
  long *local_70;
  __basic_future<TimeRepresentation<count_time<9,_long>_>_> local_68;
  _func_int **local_58 [2];
  shared_guarded<helics::AsyncFedCallInfo,_std::mutex> *local_48;
  unique_lock<std::mutex> local_40;
  
  if (this->singleThreadFederate == true) {
    this_00 = (InvalidFunctionCall *)__cxa_allocate_exception(0x28);
    pcVar5 = "Async function calls and methods are not allowed for single thread federates";
    sVar6 = 0x4c;
  }
  else {
    LOCK();
    bVar7 = (this->currentMode)._M_i == EXECUTING;
    if (bVar7) {
      (this->currentMode)._M_i = PENDING_TIME;
    }
    UNLOCK();
    if (bVar7) {
      if ((this->timeRequestEntryCallback).super__Function_base._M_manager != (_Manager_type)0x0) {
        std::
        function<void_(TimeRepresentation<count_time<9,_long>_>,_TimeRepresentation<count_time<9,_long>_>,_bool)>
        ::operator()(&this->timeRequestEntryCallback,
                     (TimeRepresentation<count_time<9,_long>_>)(this->mCurrentTime).internalTimeCode
                     ,(TimeRepresentation<count_time<9,_long>_>)
                      nextInternalTimeStep.internalTimeCode,false);
      }
      local_48 = (this->asyncCallInfo)._M_t.
                 super___uniq_ptr_impl<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>,_std::default_delete<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_*,_std::default_delete<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_>_>
                 .
                 super__Head_base<0UL,_gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_*,_false>
                 ._M_head_impl;
      local_40._M_device = &local_48->m_mutex;
      local_40._M_owns = false;
      std::unique_lock<std::mutex>::lock(&local_40);
      local_40._M_owns = true;
      local_88.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)0x0;
      local_88.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x58);
      p_Var3->_M_use_count = 1;
      p_Var3->_M_weak_count = 1;
      p_Var3->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_004d9f00;
      peVar1 = (element_type *)(p_Var3 + 1);
      p_Var3[2]._M_use_count = 0;
      p_Var3[1]._M_use_count = 0;
      p_Var3[1]._M_weak_count = 0;
      *(undefined8 *)((long)&p_Var3[1]._M_weak_count + 1) = 0;
      p_Var3[3]._vptr__Sp_counted_base = (_func_int **)0x0;
      p_Var3[3]._M_use_count = 0;
      p_Var3[1]._vptr__Sp_counted_base = (_func_int **)&PTR___Async_state_impl_004d9f50;
      p_Var4 = (_Result<TimeRepresentation<count_time<9,_long>_>_> *)operator_new(0x20);
      std::__future_base::_Result<TimeRepresentation<count_time<9,_long>_>_>::_Result(p_Var4);
      p_Var3[4]._vptr__Sp_counted_base = (_func_int **)p_Var4;
      *(Federate **)&p_Var3[4]._M_use_count = this;
      p_Var3[5]._vptr__Sp_counted_base = (_func_int **)nextInternalTimeStep.internalTimeCode;
      local_58[0] = (_func_int **)0x0;
      local_70 = (long *)operator_new(0x20);
      *local_70 = (long)&PTR___State_004d9fa8;
      local_70[1] = (long)peVar1;
      local_70[2] = (long)std::__future_base::
                          _Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/Federate.cpp:1023:44)>_>,_TimeRepresentation<count_time<9,_long>_>_>
                          ::_M_run;
      local_70[3] = 0;
      std::thread::_M_start_thread(local_58,&local_70,0);
      if (local_70 != (long *)0x0) {
        (**(code **)(*local_70 + 8))();
      }
      _Var2._M_pi = local_88.
                    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi;
      if (p_Var3[3]._vptr__Sp_counted_base != (_func_int **)0x0) {
        std::terminate();
      }
      p_Var3[3]._vptr__Sp_counted_base = local_58[0];
      bVar7 = local_88.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_88.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = peVar1;
      local_88.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var3;
      if (bVar7) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Var2._M_pi);
      }
      if (local_88.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr == (element_type *)0x0) {
        p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x48);
        p_Var3->_M_use_count = 1;
        p_Var3->_M_weak_count = 1;
        p_Var3->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_004d9fe8;
        p_Var3[2]._M_use_count = 0;
        p_Var3[1]._M_use_count = 0;
        p_Var3[1]._M_weak_count = 0;
        *(undefined8 *)((long)&p_Var3[1]._M_weak_count + 1) = 0;
        p_Var3[1]._vptr__Sp_counted_base = (_func_int **)&PTR___Deferred_state_004da038;
        p_Var4 = (_Result<TimeRepresentation<count_time<9,_long>_>_> *)operator_new(0x20);
        std::__future_base::_Result<TimeRepresentation<count_time<9,_long>_>_>::_Result(p_Var4);
        _Var2._M_pi = local_88.
                      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi;
        p_Var3[3]._vptr__Sp_counted_base = (_func_int **)p_Var4;
        *(Federate **)&p_Var3[3]._M_use_count = this;
        p_Var3[4]._vptr__Sp_counted_base = (_func_int **)nextInternalTimeStep.internalTimeCode;
        bVar7 = local_88.
                super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_88.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (element_type *)(p_Var3 + 1);
        local_88.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var3;
        if (bVar7) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Var2._M_pi);
        }
      }
      std::__basic_future<TimeRepresentation<count_time<9,_long>_>_>::__basic_future
                (&local_68,&local_88);
      if (local_88.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_88.
                   super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      _Var2._M_pi = local_68._M_state.
                    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi;
      peVar1 = local_68._M_state.
               super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      local_68._M_state.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_68._M_state.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               (local_48->m_obj).timeRequestFuture.
               super___basic_future<TimeRepresentation<count_time<9,_long>_>_>._M_state.
               super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
      (local_48->m_obj).timeRequestFuture.
      super___basic_future<TimeRepresentation<count_time<9,_long>_>_>._M_state.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           peVar1;
      (local_48->m_obj).timeRequestFuture.
      super___basic_future<TimeRepresentation<count_time<9,_long>_>_>._M_state.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = _Var2._M_pi;
      if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
      }
      if (local_68._M_state.
          super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_68._M_state.
                   super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      std::unique_lock<std::mutex>::~unique_lock(&local_40);
      return;
    }
    this_00 = (InvalidFunctionCall *)__cxa_allocate_exception(0x28);
    pcVar5 = "cannot call request time in present state";
    sVar6 = 0x29;
  }
  message._M_str = pcVar5;
  message._M_len = sVar6;
  InvalidFunctionCall::InvalidFunctionCall(this_00,message);
  __cxa_throw(this_00,&InvalidFunctionCall::typeinfo,HelicsException::~HelicsException);
}

Assistant:

void Federate::requestTimeAsync(Time nextInternalTimeStep)
{
    if (singleThreadFederate) {
        throw(InvalidFunctionCall(
            "Async function calls and methods are not allowed for single thread federates"));
    }
    auto exp = Modes::EXECUTING;
    if (currentMode.compare_exchange_strong(exp, Modes::PENDING_TIME)) {
        preTimeRequestOperations(nextInternalTimeStep, false);
        auto asyncInfo = asyncCallInfo->lock();
        asyncInfo->timeRequestFuture =
            std::async(std::launch::async, [this, nextInternalTimeStep]() {
                return coreObject->timeRequest(fedID, nextInternalTimeStep);
            });
    } else {
        throw(InvalidFunctionCall("cannot call request time in present state"));
    }
}